

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> __thiscall
jaegertracing::Tracer::StartSpanWithOptions
          (Tracer *this,string_view operationName,StartSpanOptions *options)

{
  uint64_t uVar1;
  uint64_t spanID_00;
  byte flags_00;
  bool bVar2;
  uchar flags_01;
  invalid_argument *this_00;
  TraceID *pTVar3;
  string *value;
  element_type *peVar4;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *__x;
  StrMap *pSVar5;
  Tracer *this_01;
  pointer in_R8;
  undefined4 in_stack_fffffffffffff76c;
  uint64_t local_7b8;
  ostringstream oss;
  exception *ex;
  string local_588;
  undefined1 local_568 [24];
  tuple<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  local_550;
  undefined1 local_540 [8];
  time_point startTimeSteady;
  time_point startTimeSystem;
  allocator local_479;
  string local_478;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_458;
  SpanContext local_420;
  uchar local_369;
  uint64_t uStack_368;
  uchar flags_1;
  uint64_t parentID_1;
  uint64_t spanID_1;
  TraceID traceID_1;
  allocator local_339;
  string local_338;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  SpanContext local_2e0;
  string local_230;
  undefined1 local_210 [8];
  SamplingStatus samplingStatus;
  string local_1e8;
  Tag local_1c8;
  byte local_17d;
  undefined4 local_17c;
  uchar flags;
  uint64_t uStack_178;
  int parentID;
  uint64_t spanID;
  TraceID traceID;
  uint64_t lowID;
  uint64_t highID;
  SpanContext ctx;
  undefined1 local_98 [7];
  bool newTrace;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> samplerTags;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *references;
  SpanContext *self;
  SpanContext *parent;
  undefined1 local_58 [8];
  AnalyzedReferences result;
  StartSpanOptions *options_local;
  Tracer *this_local;
  string_view operationName_local;
  
  this_local = (Tracer *)operationName.length_;
  this_01 = (Tracer *)operationName.data_;
  result._references.
  super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_R8;
  operationName_local.data_ = (char *)options;
  operationName_local.length_ = (size_t)this;
  analyzeReferences((AnalyzedReferences *)local_58,this_01,
                    (vector<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>,_std::allocator<std::pair<opentracing::v3::SpanReferenceType,_const_opentracing::v3::SpanContext_*>_>_>
                     *)&(in_R8->_spanContext)._traceID._low);
  samplerTags.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&result._self;
  if ((result._parent != (SpanContext *)0x0) &&
     ((local_58 != (undefined1  [8])0x0 ||
      (bVar2 = std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::
               empty((vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
                     samplerTags.
                     super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar2)))) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Self and references are exclusive. Only one of them can be specified");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_98);
  ctx._mutex.super___mutex_base._M_mutex.__size[0x27] = '\0';
  SpanContext::SpanContext((SpanContext *)&highID);
  if ((local_58 == (undefined1  [8])0x0) ||
     (bVar2 = SpanContext::isValid((SpanContext *)local_58), !bVar2)) {
    ctx._mutex.super___mutex_base._M_mutex.__size[0x27] = '\x01';
    lowID = 0;
    traceID._low = 0;
    if (result._parent == (SpanContext *)0x0) {
      if ((this_01->_options & 1U) != 0) {
        lowID = randomID(this_01);
      }
      traceID._low = randomID(this_01);
    }
    else {
      pTVar3 = SpanContext::traceID(result._parent);
      lowID = TraceID::high(pTVar3);
      pTVar3 = SpanContext::traceID(result._parent);
      traceID._low = TraceID::low(pTVar3);
    }
    TraceID::TraceID((TraceID *)&spanID,lowID,traceID._low);
    if (result._parent == (SpanContext *)0x0) {
      local_7b8 = TraceID::low((TraceID *)&spanID);
    }
    else {
      local_7b8 = SpanContext::spanID(result._parent);
    }
    uStack_178 = local_7b8;
    local_17c = 0;
    local_17d = 0;
    if ((local_58 == (undefined1  [8])0x0) ||
       (bVar2 = SpanContext::isDebugIDContainerOnly((SpanContext *)local_58), !bVar2)) {
      peVar4 = std::
               __shared_ptr_access<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this_01->_sampler);
      opentracing::v3::string_view::operator_cast_to_string(&local_230,(string_view *)&this_local);
      (*peVar4->_vptr_Sampler[2])(local_210,peVar4,&spanID,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      bVar2 = samplers::SamplingStatus::isSampled((SamplingStatus *)local_210);
      if (bVar2) {
        local_17d = local_17d | 1;
        __x = samplers::SamplingStatus::tags((SamplingStatus *)local_210);
        std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator=
                  ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_98,__x);
      }
      samplers::SamplingStatus::~SamplingStatus((SamplingStatus *)local_210);
    }
    else {
      local_17d = local_17d | 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1e8,"jaeger-debug-id",
                 (allocator *)
                 ((long)&samplingStatus._tags.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      value = SpanContext::debugID_abi_cxx11_((SpanContext *)local_58);
      Tag::Tag<std::__cxx11::string_const&>(&local_1c8,&local_1e8,value);
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::push_back
                ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_98,
                 &local_1c8);
      Tag::~Tag(&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&samplingStatus._tags.
                         super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    uVar1 = uStack_178;
    flags_00 = local_17d;
    local_318._M_h._M_rehash_policy._0_8_ = 0;
    local_318._M_h._M_rehash_policy._M_next_resize = 0;
    local_318._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_318._M_h._M_element_count = 0;
    local_318._M_h._M_buckets = (__buckets_ptr)0x0;
    local_318._M_h._M_bucket_count = 0;
    local_318._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map(&local_318);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_338,"",&local_339);
    SpanContext::SpanContext(&local_2e0,(TraceID *)&spanID,uVar1,0,flags_00,&local_318,&local_338);
    SpanContext::operator=((SpanContext *)&highID,&local_2e0);
    SpanContext::~SpanContext(&local_2e0);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map(&local_318);
  }
  else {
    pTVar3 = SpanContext::traceID((SpanContext *)local_58);
    spanID_1 = pTVar3->_high;
    traceID_1._high = pTVar3->_low;
    parentID_1 = randomID(this_01);
    uStack_368 = SpanContext::spanID((SpanContext *)local_58);
    flags_01 = SpanContext::flags((SpanContext *)local_58);
    spanID_00 = parentID_1;
    uVar1 = uStack_368;
    local_458._M_h._M_rehash_policy._0_8_ = 0;
    local_458._M_h._M_rehash_policy._M_next_resize = 0;
    local_458._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_458._M_h._M_element_count = 0;
    local_458._M_h._M_buckets = (__buckets_ptr)0x0;
    local_458._M_h._M_bucket_count = 0;
    local_458._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_369 = flags_01;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map(&local_458);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_478,"",&local_479);
    SpanContext::SpanContext
              (&local_420,(TraceID *)&spanID_1,spanID_00,uVar1,flags_01,&local_458,&local_478);
    SpanContext::operator=((SpanContext *)&highID,&local_420);
    SpanContext::~SpanContext(&local_420);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map(&local_458);
  }
  if (local_58 != (undefined1  [8])0x0) {
    pSVar5 = SpanContext::baggage_abi_cxx11_((SpanContext *)local_58);
    bVar2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(pSVar5);
    if (!bVar2) {
      pSVar5 = SpanContext::baggage_abi_cxx11_((SpanContext *)local_58);
      SpanContext::withBaggage((SpanContext *)&startTimeSystem,(SpanContext *)&highID,pSVar5);
      SpanContext::operator=((SpanContext *)&highID,(SpanContext *)&startTimeSystem);
      SpanContext::~SpanContext((SpanContext *)&startTimeSystem);
    }
  }
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&startTimeSteady);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)local_540);
  anon_unknown_15::determineStartTimes
            ((anon_unknown_15 *)&local_550,
             (StartSpanOptions *)
             result._references.
             super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  tie<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)(local_568 + 8),&startTimeSteady);
  std::
  tuple<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&>
  ::operator=((tuple<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&>
               *)(local_568 + 8),&local_550);
  opentracing::v3::string_view::operator_cast_to_string(&local_588,(string_view *)&this_local);
  startSpanInternal((Tracer *)local_568,(SpanContext *)this_01,(string *)&highID,
                    (time_point *)&local_588,&startTimeSteady,
                    (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_540,
                    (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>
                     *)local_98,
                    (bool)((char)result._references.
                                 super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + '('),
                    (vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> *)
                    (CONCAT44(in_stack_fffffffffffff76c,
                              (uint)(byte)ctx._mutex.super___mutex_base._M_mutex.__size[0x27]) &
                    0xffffffff00000001));
  std::unique_ptr<opentracing::v3::Span,std::default_delete<opentracing::v3::Span>>::
  unique_ptr<jaegertracing::Span,std::default_delete<jaegertracing::Span>,void>
            ((unique_ptr<opentracing::v3::Span,std::default_delete<opentracing::v3::Span>> *)this,
             (unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> *)local_568
            );
  std::unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_>::~unique_ptr
            ((unique_ptr<jaegertracing::Span,_std::default_delete<jaegertracing::Span>_> *)local_568
            );
  std::__cxx11::string::~string((string *)&local_588);
  SpanContext::~SpanContext((SpanContext *)&highID);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_98);
  AnalyzedReferences::~AnalyzedReferences((AnalyzedReferences *)local_58);
  return (__uniq_ptr_data<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>,_true,_true>
          )(__uniq_ptr_data<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<opentracing::Span>
Tracer::StartSpanWithOptions(string_view operationName,
                             const opentracing::StartSpanOptions& options) const
    noexcept
{
    try {
        const auto result = analyzeReferences(options.references);
        const auto* parent = result._parent;
        const auto* self = result._self;
        const auto& references = result._references;
        if (self && (parent || !references.empty()))
        {
            throw std::invalid_argument("Self and references are exclusive. Only one of them can be specified");
        }

        std::vector<Tag> samplerTags;
        auto newTrace = false;
        SpanContext ctx;
        if (!parent || !parent->isValid()) {
            newTrace = true;
            auto highID = static_cast<uint64_t>(0);
            auto lowID = static_cast<uint64_t>(0);
            if (self) {
                highID = self->traceID().high();
                lowID = self->traceID().low();
            }
            else {
                if (_options & kGen128BitOption) {
                    highID = randomID();
                }
                lowID = randomID();
            }
            const TraceID traceID(highID, lowID);
            const auto spanID = self ? self->spanID() : traceID.low();
            const auto parentID = 0;
            auto flags = static_cast<unsigned char>(0);
            if (parent && parent->isDebugIDContainerOnly()) {
                flags |=
                    (static_cast<unsigned char>(SpanContext::Flag::kSampled) |
                     static_cast<unsigned char>(SpanContext::Flag::kDebug));
                samplerTags.push_back(Tag(kJaegerDebugHeader, parent->debugID()));
            }
            else {
                const auto samplingStatus =
                    _sampler->isSampled(traceID, operationName);
                if (samplingStatus.isSampled()) {
                    flags |=
                        static_cast<unsigned char>(SpanContext::Flag::kSampled);
                    samplerTags = samplingStatus.tags();
                }
            }
            ctx = SpanContext(traceID, spanID, parentID, flags, StrMap());
        }
        else {
            const auto traceID = parent->traceID();
            const auto spanID = randomID();
            const auto parentID = parent->spanID();
            const auto flags = parent->flags();
            ctx = SpanContext(traceID, spanID, parentID, flags, StrMap());
        }

        if (parent && !parent->baggage().empty()) {
            ctx = ctx.withBaggage(parent->baggage());
        }

        SystemClock::time_point startTimeSystem;
        SteadyClock::time_point startTimeSteady;
        std::tie(startTimeSystem, startTimeSteady) =
            determineStartTimes(options);
        return startSpanInternal(ctx,
                                 operationName,
                                 startTimeSystem,
                                 startTimeSteady,
                                 samplerTags,
                                 options.tags,
                                 newTrace,
                                 references);
    } catch (const std::exception& ex) {
        std::ostringstream oss;
        oss << "Error occurred in Tracer::StartSpanWithOptions: " << ex.what();
        utils::ErrorUtil::logError(*_logger, oss.str());
        return nullptr;
    } catch (...) {
        utils::ErrorUtil::logError(
            *_logger, "Error occurred in Tracer::StartSpanWithOptions");
        return nullptr;
    }
}